

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idx2Common.cpp
# Opt level: O0

void idx2::ComputeNumBricksPerLevel(idx2_file *Idx2,params *P)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 local_368;
  int local_360;
  undefined8 local_358;
  int local_350;
  int local_340;
  int iStack_33c;
  int I;
  v3i NBricksPerLevel3;
  undefined8 local_300;
  int local_2f8;
  undefined8 local_2f0;
  int local_2e8;
  anon_struct_8_2_94730de6_for_anon_union_8_4_6ba14846_for_v2<int>_1_0 local_2e4;
  v3i NBricks3;
  undefined8 local_2b8;
  int local_2b0;
  anon_union_8_4_6ba14846_for_v2<int>_1 local_2a8;
  int local_2a0;
  params *local_298;
  params *P_local;
  idx2_file *Idx2_local;
  stack_array<idx2::v3<int>,_16> *local_280;
  v3i *local_268;
  undefined8 *local_260;
  anon_struct_8_2_94730de6_for_anon_union_8_4_6ba14846_for_v2<int>_1_0 local_254;
  anon_union_8_4_6ba14846_for_v2<int>_1 local_248;
  int local_240;
  v3i *local_238;
  undefined8 *local_230;
  anon_struct_8_2_94730de6_for_anon_union_8_4_6ba14846_for_v2<int>_1_0 local_224;
  anon_union_8_4_6ba14846_for_v2<int>_1 local_218;
  int local_210;
  undefined8 *local_208;
  v3i *local_200;
  anon_union_8_4_6ba14846_for_v2<int>_1 local_1f4;
  undefined8 local_1e8;
  int local_1e0;
  undefined4 local_1d4;
  undefined8 *local_1d0;
  undefined8 local_1c4;
  undefined8 local_1b8;
  int local_1b0;
  undefined4 local_1a4;
  undefined8 *local_1a0;
  undefined8 local_194;
  undefined8 local_188;
  int local_180;
  v3i *local_178;
  undefined1 *local_170;
  undefined8 local_164;
  undefined8 local_158;
  int local_150;
  v3i *local_148;
  v3i *local_140;
  undefined8 local_138;
  int local_12c;
  int local_128;
  int local_124;
  undefined8 *local_120;
  int local_114;
  int local_110;
  int local_10c;
  undefined8 *local_108;
  int local_fc;
  int local_f8;
  int local_f4;
  undefined8 *local_f0;
  int local_e4;
  int local_e0;
  int local_dc;
  undefined8 *local_d8;
  int local_cc;
  int local_c8;
  int local_c4;
  anon_union_8_4_6ba14846_for_v2<int>_1 *local_c0;
  int local_b4;
  int local_b0;
  int local_ac;
  anon_struct_8_2_94730de6_for_anon_union_8_4_6ba14846_for_v2<int>_1_0 *local_a8;
  int local_9c;
  int local_98;
  int local_94;
  anon_struct_8_2_94730de6_for_anon_union_8_4_6ba14846_for_v2<int>_1_0 *local_90;
  undefined8 local_88;
  array<idx2::subband> *local_80;
  undefined8 local_78;
  int local_70;
  undefined8 local_68;
  int local_60;
  byte *local_58;
  undefined8 local_50;
  int local_48;
  undefined8 local_40;
  int local_38;
  long local_30;
  undefined8 local_28;
  int local_1c;
  int local_18;
  int local_14;
  undefined8 *local_10;
  
  local_200 = &Idx2->BrickDims3;
  local_80 = &Idx2->SubbandsNonExt;
  local_88 = 0;
  local_58 = (local_80->Buffer).Data;
  local_30 = *(long *)(local_58 + 8);
  local_14 = ((int)local_30 << 0xb) >> 0xb;
  local_10 = &local_28;
  local_18 = (int)((local_30 << 0x16) >> 0x2b);
  local_2b0 = (int)(local_30 * 2 >> 0x2b);
  local_28._0_4_ = local_14;
  local_28._4_4_ = local_18;
  local_40 = local_28;
  local_68 = local_28;
  local_50 = local_28;
  local_78 = local_28;
  local_2b8 = local_28;
  uVar5 = local_2b8;
  local_208 = &local_2b8;
  local_2b8._0_4_ = (int)local_28;
  local_2b8._4_4_ = (int)((ulong)local_28 >> 0x20);
  local_c4 = (local_200->field_0).field_0.X / (int)local_2b8;
  local_c8 = (Idx2->BrickDims3).field_0.field_0.Y / local_2b8._4_4_;
  local_2a0 = (Idx2->BrickDims3).field_0.field_0.Z / local_2b0;
  local_c0 = &local_1f4;
  local_1f4.field_0.X = local_c4;
  local_1f4.field_0.Y = local_c8;
  local_218 = local_1f4;
  NBricks3.field_0.field_4.YZ.field_0 = (v2<int>)(v2<int>)local_1f4;
  local_2a8 = local_1f4;
  (Idx2->GroupBrick3).field_0.field_0.Z = local_2a0;
  (Idx2->GroupBrick3).field_0.field_3.XY.field_0 = local_1f4;
  local_140 = &Idx2->Dims3;
  local_148 = &Idx2->BrickDims3;
  local_124 = (local_140->field_0).field_0.X + (local_148->field_0).field_0.X;
  local_128 = (Idx2->Dims3).field_0.field_0.Y + (Idx2->BrickDims3).field_0.field_0.Y;
  local_2f8 = (Idx2->Dims3).field_0.field_0.Z + (Idx2->BrickDims3).field_0.field_0.Z;
  local_120 = &local_138;
  local_138._0_4_ = local_124;
  local_138._4_4_ = local_128;
  local_158 = local_138;
  local_300 = local_138;
  uVar3 = local_300;
  local_1a0 = &local_300;
  local_1a4 = 1;
  local_300._0_4_ = (int)local_138;
  local_300._4_4_ = (int)((ulong)local_138 >> 0x20);
  local_f4 = (int)local_300 + -1;
  local_f8 = local_300._4_4_ + -1;
  local_2e8 = local_2f8 + -1;
  local_f0 = &local_194;
  local_194._0_4_ = local_f4;
  local_194._4_4_ = local_f8;
  local_1b8 = local_194;
  local_2f0 = local_194;
  uVar4 = local_2f0;
  local_238 = &Idx2->BrickDims3;
  local_230 = &local_2f0;
  local_2f0._0_4_ = (int)local_194;
  local_2f0._4_4_ = (int)((ulong)local_194 >> 0x20);
  local_ac = (int)local_2f0 / (local_238->field_0).field_0.X;
  local_b0 = local_2f0._4_4_ / (Idx2->BrickDims3).field_0.field_0.Y;
  NBricks3.field_0.field_0.X = local_2e8 / (Idx2->BrickDims3).field_0.field_0.Z;
  local_a8 = &local_224;
  local_224.X = local_ac;
  local_224.Y = local_b0;
  local_248.field_0 = local_224;
  NBricksPerLevel3.field_0.field_4.YZ.field_0 = (v2<int>)(v2<int>)local_224;
  local_2e4 = local_224;
  _iStack_33c = local_224;
  local_340 = 0;
  NBricksPerLevel3.field_0.field_0.X = NBricks3.field_0.field_0.X;
  while( true ) {
    if (local_340 == Idx2->NLevels) {
      return;
    }
    local_280 = &Idx2->NBricks3;
    Idx2_local._4_4_ = local_340;
    if (0xf < local_340) break;
    (Idx2->NBricks3).Arr[local_340].field_0.field_0.Z = NBricksPerLevel3.field_0.field_0.X;
    *(anon_struct_8_2_94730de6_for_anon_union_8_4_6ba14846_for_v2<int>_1_0 *)
     (local_280->Arr + local_340) = _iStack_33c;
    local_178 = &Idx2->GroupBrick3;
    local_170 = (undefined1 *)&stack0xfffffffffffffcc4;
    local_10c = iStack_33c + (local_178->field_0).field_0.X;
    local_110 = I + (Idx2->GroupBrick3).field_0.field_0.Y;
    local_360 = NBricksPerLevel3.field_0.field_0.X + (Idx2->GroupBrick3).field_0.field_0.Z;
    local_108 = &local_164;
    local_164._0_4_ = local_10c;
    local_164._4_4_ = local_110;
    local_188 = local_164;
    local_368 = local_164;
    uVar1 = local_368;
    local_1d0 = &local_368;
    local_1d4 = 1;
    local_368._0_4_ = (int)local_164;
    local_368._4_4_ = (int)((ulong)local_164 >> 0x20);
    local_dc = (int)local_368 + -1;
    local_e0 = local_368._4_4_ + -1;
    local_350 = local_360 + -1;
    local_d8 = &local_1c4;
    local_1c4._0_4_ = local_dc;
    local_1c4._4_4_ = local_e0;
    local_1e8 = local_1c4;
    local_358 = local_1c4;
    uVar2 = local_358;
    local_268 = &Idx2->GroupBrick3;
    local_260 = &local_358;
    local_358._0_4_ = (int)local_1c4;
    local_358._4_4_ = (int)((ulong)local_1c4 >> 0x20);
    local_94 = (int)local_358 / (local_268->field_0).field_0.X;
    local_98 = local_358._4_4_ / (Idx2->GroupBrick3).field_0.field_0.Y;
    NBricksPerLevel3.field_0.field_0.X = local_350 / (Idx2->GroupBrick3).field_0.field_0.Z;
    local_90 = &local_254;
    local_254.X = local_94;
    local_254.Y = local_98;
    _iStack_33c = local_254;
    local_340 = local_340 + 1;
    local_368 = uVar1;
    local_358 = uVar2;
    local_1e0 = local_350;
    local_180 = local_360;
    local_114 = local_360;
    local_e4 = local_350;
    local_9c = NBricksPerLevel3.field_0.field_0.X;
  }
  local_300 = uVar3;
  local_2f0 = uVar4;
  local_2b8 = uVar5;
  local_298 = P;
  P_local = (params *)Idx2;
  local_240 = NBricks3.field_0.field_0.X;
  local_210 = local_2a0;
  local_1b0 = local_2e8;
  local_150 = local_2f8;
  local_12c = local_2f8;
  local_fc = local_2e8;
  local_cc = local_2a0;
  local_b4 = NBricks3.field_0.field_0.X;
  local_70 = local_2b0;
  local_60 = local_2b0;
  local_48 = local_2b0;
  local_38 = local_2b0;
  local_1c = local_2b0;
  __assert_fail("Idx < N",
                "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                ,0x20c,
                "t &idx2::stack_array<idx2::v3<int>, 16>::operator[](int) const [t = idx2::v3<int>, N = 16]"
               );
}

Assistant:

static void
ComputeNumBricksPerLevel(idx2_file* Idx2, const params& P)
{
  Idx2->GroupBrick3 = Idx2->BrickDims3 / Dims(Idx2->SubbandsNonExt[0].Grid);
  v3i NBricks3 = (Idx2->Dims3 + Idx2->BrickDims3 - 1) / Idx2->BrickDims3;
  v3i NBricksPerLevel3 = NBricks3;
  idx2_For (int, I, 0, Idx2->NLevels)
  {
    Idx2->NBricks3[I] = NBricksPerLevel3;
    NBricksPerLevel3 = (NBricksPerLevel3 + Idx2->GroupBrick3 - 1) / Idx2->GroupBrick3;
  }
}